

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

void jpeg_add_quant_table
               (j_compress_ptr cinfo,int which_tbl,uint *basic_table,int scale_factor,
               boolean force_baseline)

{
  long *plVar1;
  JQUANT_TBL *pJVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  long temp;
  int i;
  JQUANT_TBL **qtblptr;
  long local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  
  if (*(int *)((long)in_RDI + 0x24) != 100) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x15;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  if ((in_ESI < 0) || (3 < in_ESI)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x20;
    *(int *)(*in_RDI + 0x2c) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  plVar1 = in_RDI + (long)in_ESI + 0xe;
  if (*plVar1 == 0) {
    pJVar2 = jpeg_alloc_quant_table
                       ((j_common_ptr)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
    ;
    *plVar1 = (long)pJVar2;
  }
  for (iVar3 = 0; iVar3 < 0x40; iVar3 = iVar3 + 1) {
    local_38 = (long)((ulong)*(uint *)(in_RDX + (long)iVar3 * 4) * (long)in_ECX + 0x32) / 100;
    if (local_38 < 1) {
      local_38 = 1;
    }
    if (0x7fff < local_38) {
      local_38 = 0x7fff;
    }
    if ((in_R8D != 0) && (0xff < local_38)) {
      local_38 = 0xff;
    }
    *(short *)(*plVar1 + (long)iVar3 * 2) = (short)local_38;
  }
  *(undefined4 *)(*plVar1 + 0x80) = 0;
  return;
}

Assistant:

GLOBAL(void)
jpeg_add_quant_table (j_compress_ptr cinfo, int which_tbl,
		      const unsigned int *basic_table,
		      int scale_factor, boolean force_baseline)
/* Define a quantization table equal to the basic_table times
 * a scale factor (given as a percentage).
 * If force_baseline is TRUE, the computed quantization table entries
 * are limited to 1..255 for JPEG baseline compatibility.
 */
{
  JQUANT_TBL ** qtblptr;
  int i;
  long temp;

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  if (which_tbl < 0 || which_tbl >= NUM_QUANT_TBLS)
    ERREXIT1(cinfo, JERR_DQT_INDEX, which_tbl);

  qtblptr = & cinfo->quant_tbl_ptrs[which_tbl];

  if (*qtblptr == NULL)
    *qtblptr = jpeg_alloc_quant_table((j_common_ptr) cinfo);

  for (i = 0; i < DCTSIZE2; i++) {
    temp = ((long) basic_table[i] * scale_factor + 50L) / 100L;
    /* limit the values to the valid range */
    if (temp <= 0L) temp = 1L;
    if (temp > 32767L) temp = 32767L; /* max quantizer needed for 12 bits */
    if (force_baseline && temp > 255L)
      temp = 255L;		/* limit to baseline range if requested */
    (*qtblptr)->quantval[i] = (UINT16) temp;
  }

  /* Initialize sent_table FALSE so table will be written to JPEG file. */
  (*qtblptr)->sent_table = FALSE;
}